

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservationModelDiscrete.cpp
# Opt level: O0

Index __thiscall
ObservationModelDiscrete::SampleJointObservation
          (ObservationModelDiscrete *this,Index jaI,Index sucI)

{
  int iVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  double dVar2;
  int i;
  Index jo;
  double sum;
  double randNr;
  Index local_28;
  double local_20;
  
  iVar1 = rand();
  local_20 = 0.0;
  local_28 = 0;
  while( true ) {
    if ((int)in_RDI[2] <= (int)local_28) {
      return 0;
    }
    dVar2 = (double)(**(code **)(*in_RDI + 0x20))(in_RDI,in_ESI,in_EDX,local_28);
    local_20 = dVar2 + local_20;
    if ((double)iVar1 / 2147483648.0 <= local_20) break;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

Index ObservationModelDiscrete::SampleJointObservation(Index jaI, Index sucI)
{
    double randNr=rand() / (RAND_MAX + 1.0);

    double sum=0;
    Index jo=0;
    int i;
    
    for(i=0;i<_m_nrJointObservations;i++)
    {
        sum+=Get(jaI,sucI,i);
        if(randNr<=sum)
        {
            jo=i;
            break;
        }
    }
    
    return(jo);
}